

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

double __thiscall
Fl_Text_Display::string_width(Fl_Text_Display *this,char *string,int length,int style)

{
  double dVar1;
  int local_2c;
  Fl_Fontsize local_28;
  int si;
  Fl_Fontsize fsize;
  Fl_Font font;
  int style_local;
  int length_local;
  char *string_local;
  Fl_Text_Display *this_local;
  
  if ((this->mNStyles == 0) || ((style & 0xffU) == 0)) {
    si = textfont(this);
    local_28 = textsize(this);
  }
  else {
    local_2c = (style & 0xffU) - 0x41;
    if (local_2c < 0) {
      local_2c = 0;
    }
    else if (this->mNStyles <= local_2c) {
      local_2c = this->mNStyles + -1;
    }
    si = this->mStyleTable[local_2c].font;
    local_28 = this->mStyleTable[local_2c].size;
  }
  fl_font(si,local_28);
  dVar1 = fl_width(string,length);
  return dVar1;
}

Assistant:

double Fl_Text_Display::string_width( const char *string, int length, int style ) const {
  IS_UTF8_ALIGNED(string)

  Fl_Font font;
  Fl_Fontsize fsize;

  if ( mNStyles && (style & STYLE_LOOKUP_MASK) ) {
    int si = (style & STYLE_LOOKUP_MASK) - 'A';
    if (si < 0) si = 0;
    else if (si >= mNStyles) si = mNStyles - 1;

    font  = mStyleTable[si].font;
    fsize = mStyleTable[si].size;
  } else {
    font  = textfont();
    fsize = textsize();
  }
  fl_font( font, fsize );
  return fl_width( string, length );
}